

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.cpp
# Opt level: O1

bool __thiscall
cppcms::cache_interface::fetch(cache_interface *this,string *key,string *result,bool notriggers)

{
  _Rb_tree_header *p_Var1;
  base_cache *pbVar2;
  char cVar3;
  int iVar4;
  _Base_ptr p_Var5;
  const_iterator p;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_trig;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_58;
  
  pbVar2 = (this->cache_module_).p_;
  if (pbVar2 == (base_cache *)0x0) {
    cVar3 = '\0';
  }
  else {
    p_Var1 = &_Stack_58._M_impl.super__Rb_tree_header;
    _Stack_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    iVar4 = (**pbVar2->_vptr_base_cache)();
    cVar3 = (char)iVar4;
    p_Var5 = _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((!notriggers &&
        (_Rb_tree_header *)_Stack_58._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) &&
        cVar3 == '\x01') {
      do {
        add_trigger(this,(string *)(p_Var5 + 1));
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&_Stack_58);
  }
  return (bool)cVar3;
}

Assistant:

bool cache_interface::fetch(string const &key,string &result,bool notriggers)
{
	if(nocache()) return false;
	set<string> new_trig;

	if(cache_module_->fetch(key,result, (notriggers ? 0 : &new_trig))) {
		if(!notriggers) {
			std::set<std::string>::const_iterator p;
			for(p=new_trig.begin();p!=new_trig.end();++p)
				add_trigger(*p);
		}
		return true;
	}
	return false;
}